

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O1

void initialize_impute_calc<ImputedData<int,double>,InputData<float,int>>
               (ImputedData<int,_double> *imp,InputData<float,_int> *input_data,size_t row)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar1;
  float *pfVar2;
  pointer puVar3;
  size_t sVar4;
  int *piVar5;
  int *piVar6;
  unsigned_long uVar7;
  int *piVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  size_t sVar12;
  size_t sVar13;
  size_type __n;
  vector<double,_std::allocator<double>_> *this;
  size_t sVar14;
  long lVar15;
  ulong uVar16;
  value_type_conflict local_48;
  pointer local_40;
  float *local_38;
  
  imp->n_missing_num = 0;
  imp->n_missing_cat = 0;
  imp->n_missing_sp = 0;
  if (input_data->numeric_data == (float *)0x0) {
    if (input_data->Xc_indptr == (int *)0x0) goto LAB_0025852b;
    std::vector<int,_std::allocator<int>_>::resize(&imp->missing_sp,input_data->ncols_numeric);
    sVar4 = input_data->ncols_numeric;
    if (sVar4 != 0) {
      local_40 = (imp->missing_sp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_38 = input_data->Xc;
      piVar6 = input_data->Xc_ind;
      piVar5 = input_data->Xc_indptr;
      sVar14 = 0;
      sVar12 = imp->n_missing_sp;
      do {
        lVar9 = (long)piVar5[sVar14];
        lVar15 = (long)piVar5[sVar14 + 1];
        piVar8 = piVar6 + lVar9;
        uVar11 = lVar15 * 4 + lVar9 * -4 >> 2;
        while (0 < (long)uVar11) {
          uVar16 = uVar11 >> 1;
          uVar10 = ~uVar16 + uVar11;
          uVar11 = uVar16;
          if ((ulong)(long)piVar8[uVar16] < row) {
            piVar8 = piVar8 + uVar16 + 1;
            uVar11 = uVar10;
          }
        }
        sVar13 = sVar12;
        if (((piVar8 != piVar6 + lVar15) && (*piVar8 == (int)row)) &&
           (0x7f7fffff < (*(uint *)((long)local_38 + ((long)piVar8 - (long)piVar6)) & 0x7fffffff)))
        {
          sVar13 = sVar12 + 1;
          imp->n_missing_sp = sVar13;
          local_40[sVar12] = (int)sVar14;
        }
        sVar14 = sVar14 + 1;
        sVar12 = sVar13;
      } while (sVar14 != sVar4);
    }
    local_48 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&imp->sp_num_sum,imp->n_missing_sp,&local_48);
    this = &imp->sp_num_weight;
    __n = imp->n_missing_sp;
  }
  else {
    pvVar1 = &imp->missing_num;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (pvVar1,input_data->ncols_numeric);
    if (input_data->ncols_numeric != 0) {
      pfVar2 = input_data->numeric_data;
      puVar3 = (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar11 = 0;
      do {
        if (0x7f7fffff < (uint)ABS(pfVar2[row + input_data->nrows * uVar11])) {
          sVar4 = imp->n_missing_num;
          imp->n_missing_num = sVar4 + 1;
          puVar3[sVar4] = uVar11;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 < input_data->ncols_numeric);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(pvVar1,imp->n_missing_num);
    local_48 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&imp->num_sum,imp->n_missing_num,&local_48);
    this = &imp->num_weight;
    __n = imp->n_missing_num;
  }
  local_48 = 0.0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign(this,__n,&local_48);
LAB_0025852b:
  if (input_data->categ_data != (int *)0x0) {
    pvVar1 = &imp->missing_cat;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (pvVar1,input_data->ncols_categ);
    if (input_data->ncols_categ != 0) {
      piVar6 = input_data->categ_data;
      puVar3 = (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar11 = 0;
      do {
        if (piVar6[row + input_data->nrows * uVar11] < 0) {
          sVar4 = imp->n_missing_cat;
          imp->n_missing_cat = sVar4 + 1;
          puVar3[sVar4] = uVar11;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 < input_data->ncols_categ);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(pvVar1,imp->n_missing_cat);
    local_48 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&imp->cat_weight,imp->n_missing_cat,&local_48);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(&imp->cat_sum,input_data->ncols_categ);
    if (imp->n_missing_cat != 0) {
      uVar11 = 0;
      do {
        uVar7 = (imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar11];
        local_48 = 0.0;
        std::vector<double,_std::allocator<double>_>::_M_fill_assign
                  ((imp->cat_sum).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar7,(long)input_data->ncat[uVar7],
                   &local_48);
        uVar11 = uVar11 + 1;
      } while (uVar11 < imp->n_missing_cat);
    }
  }
  return;
}

Assistant:

void initialize_impute_calc(ImputedData &imp, InputData &input_data, size_t row)
{
    imp.n_missing_num = 0;
    imp.n_missing_cat = 0;
    imp.n_missing_sp  = 0;

    if (input_data.numeric_data != NULL)
    {
        imp.missing_num.resize(input_data.ncols_numeric);
        for (size_t col = 0; col < input_data.ncols_numeric; col++)
            if (is_na_or_inf(input_data.numeric_data[row + col * input_data.nrows]))
                imp.missing_num[imp.n_missing_num++] = col;
        imp.missing_num.resize(imp.n_missing_num);
        imp.num_sum.assign(imp.n_missing_num,    0);
        imp.num_weight.assign(imp.n_missing_num, 0);
    }

    else if (input_data.Xc_indptr != NULL)
    {
        imp.missing_sp.resize(input_data.ncols_numeric);
        decltype(input_data.Xc_indptr) res;
        for (size_t col = 0; col < input_data.ncols_numeric; col++)
        {
            res = std::lower_bound(input_data.Xc_ind + input_data.Xc_indptr[col],
                                   input_data.Xc_ind + input_data.Xc_indptr[col + 1],
                                   row);
            if (
                res != input_data.Xc_ind + input_data.Xc_indptr[col + 1] && 
                *res == static_cast<typename std::remove_pointer<decltype(res)>::type>(row) && 
                is_na_or_inf(input_data.Xc[res - input_data.Xc_ind])
                )
            {
                imp.missing_sp[imp.n_missing_sp++] = col;
            }
        }
        imp.sp_num_sum.assign(imp.n_missing_sp,    0);
        imp.sp_num_weight.assign(imp.n_missing_sp, 0);
    }
    
    if (input_data.categ_data != NULL)
    {
        imp.missing_cat.resize(input_data.ncols_categ);
        for (size_t col = 0; col < input_data.ncols_categ; col++)
            if (input_data.categ_data[row + col * input_data.nrows] < 0)
                imp.missing_cat[imp.n_missing_cat++] = col;
        imp.missing_cat.resize(imp.n_missing_cat);
        imp.cat_weight.assign(imp.n_missing_cat, 0);
        imp.cat_sum.resize(input_data.ncols_categ);
        for (size_t cat = 0; cat < imp.n_missing_cat; cat++)
            imp.cat_sum[imp.missing_cat[cat]].assign(input_data.ncat[imp.missing_cat[cat]], 0);
    }
}